

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O0

void __thiscall
capnp::RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::
RpcSystem<capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
          (RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *this,
          VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
          *network,Maybe<capnp::Capability::Client> *bootstrap)

{
  Maybe<capnp::Capability::Client> *other;
  Maybe<capnp::Capability::Client> local_38;
  Maybe<capnp::Capability::Client> *local_20;
  Maybe<capnp::Capability::Client> *bootstrap_local;
  VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
  *network_local;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *this_local;
  
  local_20 = bootstrap;
  bootstrap_local = (Maybe<capnp::Capability::Client> *)network;
  network_local =
       (VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
        *)this;
  other = kj::mv<kj::Maybe<capnp::Capability::Client>>(bootstrap);
  kj::Maybe<capnp::Capability::Client>::Maybe(&local_38,other);
  capnp::_::RpcSystemBase::RpcSystemBase
            (&this->super_RpcSystemBase,&network->super_VatNetworkBase,&local_38);
  kj::Maybe<capnp::Capability::Client>::~Maybe(&local_38);
  return;
}

Assistant:

RpcSystem<VatId>::RpcSystem(
      VatNetwork<VatId, ThirdPartyCompletion, ThirdPartyToAwait, ThirdPartyToContact,
                 JoinResult>& network,
      kj::Maybe<Capability::Client> bootstrap)
    : _::RpcSystemBase(network, kj::mv(bootstrap)) {}